

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::SingularString::GenerateInlineAccessorDefinitions
          (SingularString *this,Printer *p)

{
  Descriptor *descriptor;
  Printer *pPVar1;
  long lVar2;
  char *in_R9;
  string_view prefix;
  allocator<char> local_66f;
  allocator<char> local_66e;
  allocator<char> local_66d;
  allocator<char> local_66c;
  allocator<char> local_66b;
  allocator<char> local_66a;
  allocator<char> local_669;
  _Any_data local_668;
  code *local_658;
  code *pcStack_650;
  Printer *p_local;
  undefined1 *local_640;
  undefined8 local_638;
  undefined1 local_630 [8];
  undefined8 uStack_628;
  undefined1 *local_620;
  undefined8 local_618;
  undefined1 local_610 [8];
  undefined8 uStack_608;
  undefined1 *local_600;
  undefined8 local_5f8;
  undefined1 local_5f0 [8];
  undefined8 uStack_5e8;
  undefined1 *local_5e0;
  undefined8 local_5d8;
  undefined1 local_5d0 [8];
  undefined8 uStack_5c8;
  undefined1 *local_5c0;
  undefined8 local_5b8;
  undefined1 local_5b0 [8];
  undefined8 uStack_5a8;
  undefined1 *local_5a0;
  undefined8 local_598;
  undefined1 local_590 [8];
  undefined8 uStack_588;
  Printer *local_580;
  string local_578;
  string local_558;
  undefined1 local_538 [64];
  char local_4f8;
  undefined1 *local_4f0;
  undefined8 local_4e8;
  undefined1 local_4e0 [16];
  undefined1 local_4d0;
  undefined1 local_488;
  undefined1 *local_480;
  undefined8 local_478;
  undefined1 local_470 [8];
  undefined8 uStack_468;
  variant<std::__cxx11::string,std::function<bool()>> local_460 [32];
  char local_440;
  undefined1 *local_438;
  undefined8 local_430;
  undefined1 local_428 [16];
  undefined1 local_418;
  undefined1 local_3d0;
  undefined1 *local_3c8;
  undefined8 local_3c0;
  undefined1 local_3b8 [8];
  undefined8 uStack_3b0;
  variant<std::__cxx11::string,std::function<bool()>> local_3a8 [32];
  char local_388;
  undefined1 *local_380;
  undefined8 local_378;
  undefined1 local_370 [16];
  undefined1 local_360;
  undefined1 local_318;
  undefined1 *local_310;
  undefined8 local_308;
  undefined1 local_300 [8];
  undefined8 uStack_2f8;
  variant<std::__cxx11::string,std::function<bool()>> local_2f0 [32];
  char local_2d0;
  undefined1 *local_2c8;
  undefined8 local_2c0;
  undefined1 local_2b8 [16];
  undefined1 local_2a8;
  undefined1 local_260;
  Sub local_258;
  undefined1 *local_1a0;
  undefined8 local_198;
  undefined1 local_190 [8];
  undefined8 uStack_188;
  variant<std::__cxx11::string,std::function<bool()>> local_180 [32];
  char local_160;
  undefined1 *local_158;
  undefined8 local_150;
  undefined1 local_148 [16];
  undefined1 local_138;
  undefined1 local_f0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  variant<std::__cxx11::string,std::function<bool()>> local_c8 [32];
  char local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  p_local = p;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a0,"if_IsDefault",&local_669)
  ;
  local_538._0_8_ = local_538 + 0x10;
  if (local_5a0 == local_590) {
    local_538._24_8_ = uStack_588;
  }
  else {
    local_538._0_8_ = local_5a0;
  }
  local_538._8_8_ = local_598;
  local_598 = 0;
  local_590[0] = 0;
  local_658 = (code *)0x0;
  pcStack_650 = (code *)0x0;
  local_668._M_unused._M_object = (void *)0x0;
  local_668._8_8_ = 0;
  local_5a0 = local_590;
  local_668._M_unused._M_object = operator_new(0x18);
  *(SingularString **)local_668._M_unused._0_8_ = this;
  *(Printer ***)((long)local_668._M_unused._0_8_ + 8) = &p_local;
  *(code *)((long)local_668._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_650 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_658 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            ((variant<std::__cxx11::string,std::function<bool()>> *)(local_538 + 0x20),
             (function<bool_()> *)&local_668);
  std::_Function_base::~_Function_base((_Function_base *)&local_668);
  local_4f0 = local_4e0;
  local_4e8 = 0;
  local_4e0[0] = 0;
  local_4d0 = 0;
  if (local_4f8 == '\x01') {
    std::__cxx11::string::assign((char *)&local_4f0);
  }
  local_488 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5c0,"update_hasbit",&local_66a);
  local_480 = local_470;
  if (local_5c0 == local_5b0) {
    uStack_468 = uStack_5a8;
  }
  else {
    local_480 = local_5c0;
  }
  local_478 = local_5b8;
  local_5b8 = 0;
  local_5b0[0] = 0;
  local_658 = (code *)0x0;
  pcStack_650 = (code *)0x0;
  local_668._M_unused._M_object = (void *)0x0;
  local_668._8_8_ = 0;
  local_5c0 = local_5b0;
  local_580 = p;
  local_668._M_unused._M_object = operator_new(0x18);
  *(Printer ***)local_668._M_unused._0_8_ = &p_local;
  *(SingularString **)((long)local_668._M_unused._0_8_ + 8) = this;
  *(code *)((long)local_668._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_650 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_658 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_460,(function<bool_()> *)&local_668);
  std::_Function_base::~_Function_base((_Function_base *)&local_668);
  local_438 = local_428;
  local_430 = 0;
  local_428[0] = 0;
  local_418 = 0;
  if (local_440 == '\x01') {
    std::__cxx11::string::assign((char *)&local_438);
  }
  local_3d0 = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5e0,"set_args",&local_66b);
  local_3c8 = local_3b8;
  if (local_5e0 == local_5d0) {
    uStack_3b0 = uStack_5c8;
  }
  else {
    local_3c8 = local_5e0;
  }
  local_3c0 = local_5d8;
  local_5d8 = 0;
  local_5d0[0] = 0;
  local_658 = (code *)0x0;
  pcStack_650 = (code *)0x0;
  local_668._M_unused._M_object = (void *)0x0;
  local_668._8_8_ = 0;
  local_5e0 = local_5d0;
  local_668._M_unused._M_object = operator_new(0x18);
  *(Printer ***)local_668._M_unused._0_8_ = &p_local;
  *(SingularString **)((long)local_668._M_unused._0_8_ + 8) = this;
  *(code *)((long)local_668._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_650 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_658 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_3a8,(function<bool_()> *)&local_668);
  std::_Function_base::~_Function_base((_Function_base *)&local_668);
  local_380 = local_370;
  local_378 = 0;
  local_370[0] = 0;
  local_360 = 0;
  if (local_388 == '\x01') {
    std::__cxx11::string::assign((char *)&local_380);
  }
  local_318 = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_600,"check_hasbit",&local_66c)
  ;
  local_310 = local_300;
  if (local_600 == local_5f0) {
    uStack_2f8 = uStack_5e8;
  }
  else {
    local_310 = local_600;
  }
  local_308 = local_5f8;
  local_5f8 = 0;
  local_5f0[0] = 0;
  local_658 = (code *)0x0;
  pcStack_650 = (code *)0x0;
  local_668._M_unused._M_object = (void *)0x0;
  local_668._8_8_ = 0;
  local_600 = local_5f0;
  local_668._M_unused._M_object = operator_new(0x18);
  *(SingularString **)local_668._M_unused._0_8_ = this;
  *(Printer ***)((long)local_668._M_unused._0_8_ + 8) = &p_local;
  *(code *)((long)local_668._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_650 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_658 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_2f0,(function<bool_()> *)&local_668);
  std::_Function_base::~_Function_base((_Function_base *)&local_668);
  local_2c8 = local_2b8;
  local_2c0 = 0;
  local_2b8[0] = 0;
  local_2a8 = 0;
  if (local_2d0 == '\x01') {
    std::__cxx11::string::assign((char *)&local_2c8);
  }
  local_260 = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_558,"release_name",&local_66d)
  ;
  descriptor = (Descriptor *)(this->super_FieldGeneratorBase).field_;
  prefix._M_str = in_R9;
  prefix._M_len = (size_t)"release_";
  SafeFunctionName_abi_cxx11_
            (&local_578,*(cpp **)(descriptor + 0x20),descriptor,(FieldDescriptor *)0x8,prefix);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_258,&local_558,&local_578);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_620,"release_impl",&local_66e)
  ;
  local_1a0 = local_190;
  if (local_620 == local_610) {
    uStack_188 = uStack_608;
  }
  else {
    local_1a0 = local_620;
  }
  local_198 = local_618;
  local_618 = 0;
  local_610[0] = 0;
  local_658 = (code *)0x0;
  pcStack_650 = (code *)0x0;
  local_668._M_unused._M_object = (void *)0x0;
  local_668._8_8_ = 0;
  local_620 = local_610;
  local_668._M_unused._M_object = operator_new(0x18);
  *(SingularString **)local_668._M_unused._0_8_ = this;
  *(Printer ***)((long)local_668._M_unused._0_8_ + 8) = &p_local;
  *(code *)((long)local_668._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_650 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_658 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_180,(function<bool_()> *)&local_668);
  std::_Function_base::~_Function_base((_Function_base *)&local_668);
  local_158 = local_148;
  local_150 = 0;
  local_148[0] = 0;
  local_138 = 0;
  if (local_160 == '\x01') {
    std::__cxx11::string::assign((char *)&local_158);
  }
  local_f0 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_640,"set_allocated_impl",&local_66f);
  pPVar1 = local_580;
  local_e8 = local_d8;
  if (local_640 == local_630) {
    uStack_d0 = uStack_628;
  }
  else {
    local_e8 = local_640;
  }
  local_e0 = local_638;
  local_638 = 0;
  local_630[0] = 0;
  local_658 = (code *)0x0;
  pcStack_650 = (code *)0x0;
  local_668._M_unused._M_object = (void *)0x0;
  local_668._8_8_ = 0;
  local_640 = local_630;
  local_668._M_unused._M_object = operator_new(0x18);
  *(SingularString **)local_668._M_unused._0_8_ = this;
  *(Printer ***)((long)local_668._M_unused._0_8_ + 8) = &p_local;
  *(code *)((long)local_668._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_650 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_658 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_c8,(function<bool_()> *)&local_668);
  std::_Function_base::~_Function_base((_Function_base *)&local_668);
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = 0;
  local_80 = 0;
  if (local_a8 == '\x01') {
    std::__cxx11::string::assign((char *)&local_a0);
  }
  local_38 = 0;
  google::protobuf::io::Printer::Emit
            (pPVar1,local_538,7,0xa09,
             "\n        inline const std::string& $Msg$::$name$() const\n            ABSL_ATTRIBUTE_LIFETIME_BOUND {\n          $WeakDescriptorSelfPin$;\n          $annotate_get$;\n          // @@protoc_insertion_point(field_get:$pkg.Msg.field$)\n          $if_IsDefault$;\n          return _internal_$name_internal$();\n        }\n        template <typename Arg_, typename... Args_>\n        inline PROTOBUF_ALWAYS_INLINE void $Msg$::set_$name$(Arg_&& arg,\n                                                             Args_... args) {\n          $WeakDescriptorSelfPin$;\n          $TsanDetectConcurrentMutation$;\n          $PrepareSplitMessageForWrite$;\n          $update_hasbit$;\n          $field_$.$Set$(static_cast<Arg_&&>(arg), args..., $set_args$);\n          $annotate_set$;\n          // @@protoc_insertion_point(field_set:$pkg.Msg.field$)\n        }\n        inline std::string* $Msg$::mutable_$name$() ABSL_ATTRIBUTE_LIFETIME_BOUND {\n          $WeakDescriptorSelfPin$;\n          $PrepareSplitMessageForWrite$;\n          std::string* _s = _internal_mutable_$name_internal$();\n          $annotate_mutable$;\n          // @@protoc_insertion_point(field_mutable:$pkg.Msg.field$)\n          return _s;\n        }\n        inline const std::string& $Msg$::_internal_$name_internal$() const {\n          $TsanDetectConcurrentRead$;\n          $check_hasbit$;\n          return $field_$.Get();\n        }\n        inline void $Msg$::_internal_set_$name_internal$(const std::string& value) {\n          $TsanDetectConcurrentMutation$;\n          $update_hasbit$;\n          //~ Don\'t use $Set$ here; we always want the std::string variant\n          //~ regardless of whether this is a `bytes` field.\n          $field_$.Set(value, $set_args$);\n        }\n        inline std::string* $Msg$::_internal_mutable_$name_internal$() {\n          $TsanDetectConcurrentMutation$;\n          $update_hasbit$;\n          return $field_$.Mutable($lazy_args$, $set_args$);\n        }\n        inline std::string* $Msg$::$release_name$() {\n          $WeakDescriptorSelfPin$;\n          $TsanDetectConcurrentMut..." /* TRUNCATED STRING LITERAL */
            );
  lVar2 = 0x450;
  do {
    io::Printer::Sub::~Sub((Sub *)(local_538 + lVar2));
    lVar2 = lVar2 + -0xb8;
  } while (lVar2 != -0xb8);
  std::__cxx11::string::~string((string *)&local_640);
  std::__cxx11::string::~string((string *)&local_620);
  std::__cxx11::string::~string((string *)&local_578);
  std::__cxx11::string::~string((string *)&local_558);
  std::__cxx11::string::~string((string *)&local_600);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::__cxx11::string::~string((string *)&local_5a0);
  if ((this->super_FieldGeneratorBase).is_inlined_ == true) {
    io::Printer::Emit(p_local,0x7b,
                      "\n      inline bool $Msg$::_internal_$name_internal$_donated() const {\n        return $inlined_string_donated$;\n      }\n    "
                     );
  }
  return;
}

Assistant:

void SingularString::GenerateInlineAccessorDefinitions(io::Printer* p) const {
  p->Emit(
      {
          {"if_IsDefault",
           [&] {
             if (EmptyDefault() || is_oneof()) return;
             p->Emit(R"cc(
               if ($field_$.IsDefault()) {
                 return $default_variable_field$.get();
               }
             )cc");
           }},
          {"update_hasbit", [&] { UpdateHasbitSet(p, is_oneof()); }},
          {"set_args", [&] { ArgsForSetter(p, is_inlined()); }},
          {"check_hasbit",
           [&] {
             if (!is_oneof()) return;
             p->Emit(R"cc(
               if ($not_has_field$) {
                 return $kDefaultStr$;
               }
             )cc");
           }},
          {"release_name",
           SafeFunctionName(field_->containing_type(), field_, "release_")},
          {"release_impl", [&] { ReleaseImpl(p); }},
          {"set_allocated_impl", [&] { SetAllocatedImpl(p); }},
      },
      R"cc(
        inline const std::string& $Msg$::$name$() const
            ABSL_ATTRIBUTE_LIFETIME_BOUND {
          $WeakDescriptorSelfPin$;
          $annotate_get$;
          // @@protoc_insertion_point(field_get:$pkg.Msg.field$)
          $if_IsDefault$;
          return _internal_$name_internal$();
        }
        template <typename Arg_, typename... Args_>
        inline PROTOBUF_ALWAYS_INLINE void $Msg$::set_$name$(Arg_&& arg,
                                                             Args_... args) {
          $WeakDescriptorSelfPin$;
          $TsanDetectConcurrentMutation$;
          $PrepareSplitMessageForWrite$;
          $update_hasbit$;
          $field_$.$Set$(static_cast<Arg_&&>(arg), args..., $set_args$);
          $annotate_set$;
          // @@protoc_insertion_point(field_set:$pkg.Msg.field$)
        }
        inline std::string* $Msg$::mutable_$name$() ABSL_ATTRIBUTE_LIFETIME_BOUND {
          $WeakDescriptorSelfPin$;
          $PrepareSplitMessageForWrite$;
          std::string* _s = _internal_mutable_$name_internal$();
          $annotate_mutable$;
          // @@protoc_insertion_point(field_mutable:$pkg.Msg.field$)
          return _s;
        }
        inline const std::string& $Msg$::_internal_$name_internal$() const {
          $TsanDetectConcurrentRead$;
          $check_hasbit$;
          return $field_$.Get();
        }
        inline void $Msg$::_internal_set_$name_internal$(const std::string& value) {
          $TsanDetectConcurrentMutation$;
          $update_hasbit$;
          //~ Don't use $Set$ here; we always want the std::string variant
          //~ regardless of whether this is a `bytes` field.
          $field_$.Set(value, $set_args$);
        }
        inline std::string* $Msg$::_internal_mutable_$name_internal$() {
          $TsanDetectConcurrentMutation$;
          $update_hasbit$;
          return $field_$.Mutable($lazy_args$, $set_args$);
        }
        inline std::string* $Msg$::$release_name$() {
          $WeakDescriptorSelfPin$;
          $TsanDetectConcurrentMutation$;
          $annotate_release$;
          $PrepareSplitMessageForWrite$;
          // @@protoc_insertion_point(field_release:$pkg.Msg.field$)
          $release_impl$;
        }
        inline void $Msg$::set_allocated_$name$(std::string* value) {
          $WeakDescriptorSelfPin$;
          $TsanDetectConcurrentMutation$;
          $PrepareSplitMessageForWrite$;
          $set_allocated_impl$;
          $annotate_set$;
          // @@protoc_insertion_point(field_set_allocated:$pkg.Msg.field$)
        }
      )cc");

  if (is_inlined()) {
    p->Emit(R"cc(
      inline bool $Msg$::_internal_$name_internal$_donated() const {
        return $inlined_string_donated$;
      }
    )cc");
  }
}